

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O1

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::resizeRefsList
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  BuildRef *ptr;
  MemoryMonitorInterface *pMVar4;
  undefined8 uVar5;
  unsigned_long uVar6;
  char cVar7;
  BuildRef *pBVar8;
  long lVar9;
  runtime_error *this_00;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_std::plus<unsigned_long>_>
  body;
  task_group_context context;
  plus<unsigned_long> local_122;
  auto_partitioner local_121;
  anon_class_8_1_8991fb9c local_120;
  unsigned_long local_118;
  anon_class_16_2_ed117de8_conflict32 local_110;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_std::plus<unsigned_long>_>
  local_100;
  anon_class_24_3_8ee612a4_conflict3 local_e0;
  blocked_range<unsigned_long> local_c8;
  task_group_context local_b0;
  
  sVar11 = (this->scene->geometries).size_active;
  local_118 = 0;
  local_e0.func = &local_120;
  local_b0.my_version = proxy_support;
  local_b0.my_traits = (context_traits)0x4;
  local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b0.my_name = CUSTOM_CTX;
  local_120.this = this;
  local_e0.identity = &local_118;
  local_e0.reduction = &local_122;
  tbb::detail::r1::initialize(&local_b0);
  local_c8.my_begin = 0;
  local_c8.my_grainsize = 1;
  local_100.my_real_body = &local_110;
  local_100.my_value = local_118;
  local_110.reduction = &local_122;
  local_110.func = &local_e0;
  local_100.my_identity_element = &local_118;
  local_100.my_reduction = &local_122;
  local_c8.my_end = sVar11;
  tbb::detail::d1::
  start_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_std::plus<unsigned_long>_>,_const_tbb::detail::d1::auto_partitioner>
  ::run(&local_c8,&local_100,&local_121,&local_b0);
  uVar6 = local_100.my_value;
  cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_b0);
  if (cVar7 == '\0') {
    tbb::detail::r1::destroy(&local_b0);
    uVar10 = (this->refs).size_active;
    if (uVar10 < uVar6) {
      uVar3 = (this->refs).size_alloced;
      uVar12 = uVar3;
      if ((uVar3 < uVar6) && (uVar12 = uVar6, uVar3 != 0)) {
        while (uVar12 = uVar3, uVar12 < uVar6) {
          uVar3 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
        }
      }
      if (uVar6 < uVar10) {
        (this->refs).size_active = uVar6;
      }
      if ((this->refs).size_alloced == uVar12) {
        (this->refs).size_active = uVar6;
      }
      else {
        ptr = (this->refs).items;
        if (uVar12 != 0) {
          pMVar4 = (this->refs).alloc.device;
          (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,uVar12 << 6,0);
        }
        sVar11 = uVar12 << 6;
        if (sVar11 < 0x1c00000) {
          pBVar8 = (BuildRef *)alignedMalloc(sVar11,0x20);
        }
        else {
          pBVar8 = (BuildRef *)os_malloc(sVar11,&(this->refs).alloc.hugepages);
        }
        (this->refs).items = pBVar8;
        if ((this->refs).size_active != 0) {
          lVar9 = 0x20;
          uVar10 = 0;
          do {
            pBVar8 = (this->refs).items;
            puVar1 = (undefined8 *)((long)ptr + lVar9 + -0x20);
            uVar5 = puVar1[1];
            puVar2 = (undefined8 *)((long)pBVar8 + lVar9 + -0x20);
            *puVar2 = *puVar1;
            puVar2[1] = uVar5;
            puVar1 = (undefined8 *)((long)ptr + lVar9 + -0x10);
            uVar5 = puVar1[1];
            puVar2 = (undefined8 *)((long)pBVar8 + lVar9 + -0x10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar5;
            *(undefined4 *)((long)&(pBVar8->super_PrimRef).lower.field_0 + lVar9 + 8) =
                 *(undefined4 *)((long)&(ptr->super_PrimRef).lower.field_0 + lVar9 + 8);
            *(undefined8 *)((long)&(pBVar8->super_PrimRef).lower.field_0 + lVar9) =
                 *(undefined8 *)((long)&(ptr->super_PrimRef).lower.field_0 + lVar9);
            uVar10 = uVar10 + 1;
            lVar9 = lVar9 + 0x40;
          } while (uVar10 < (this->refs).size_active);
        }
        sVar11 = (this->refs).size_alloced;
        if (ptr != (BuildRef *)0x0) {
          if (sVar11 << 6 < 0x1c00000) {
            alignedFree(ptr);
          }
          else {
            os_free(ptr,sVar11 << 6,(this->refs).alloc.hugepages);
          }
        }
        if (sVar11 != 0) {
          pMVar4 = (this->refs).alloc.device;
          (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,sVar11 * -0x40,1);
        }
        (this->refs).size_active = uVar6;
        (this->refs).size_alloced = uVar12;
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void resizeRefsList ()
      {
        size_t num = parallel_reduce (size_t(0), scene->size(), size_t(0), 
          [this](const range<size_t>& r)->size_t {
            size_t c = 0;
            for (auto i=r.begin(); i<r.end(); ++i) {
              Mesh* mesh = scene->getSafe<Mesh>(i);
              if (mesh == nullptr || mesh->numTimeSteps != 1)
                continue;
              size_t meshSize = mesh->size();
              c += isSmallGeometry(mesh) ? Primitive::blocks(meshSize) : 1;
            }
            return c;
          },
          std::plus<size_t>()
        );

        if (refs.size() < num) {
          refs.resize(num);
        }
      }